

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

int uv__work_cancel(uv_loop_t *loop,uv_req_t *req,uv__work *w)

{
  int iVar1;
  bool bVar2;
  int cancelled;
  uv__work *w_local;
  uv_req_t *req_local;
  uv_loop_t *loop_local;
  
  uv_once(&once,init_once);
  uv_mutex_lock(&mutex);
  uv_mutex_lock(&w->loop->wq_mutex);
  iVar1 = uv__queue_empty(&w->wq);
  bVar2 = false;
  if (iVar1 == 0) {
    bVar2 = w->work != (_func_void_uv__work_ptr *)0x0;
  }
  if (bVar2) {
    uv__queue_remove(&w->wq);
  }
  uv_mutex_unlock(&w->loop->wq_mutex);
  uv_mutex_unlock(&mutex);
  if (bVar2) {
    w->work = uv__cancelled;
    uv_mutex_lock(&loop->wq_mutex);
    uv__queue_insert_tail(&loop->wq,&w->wq);
    uv_async_send(&loop->wq_async);
    uv_mutex_unlock(&loop->wq_mutex);
    loop_local._4_4_ = 0;
  }
  else {
    loop_local._4_4_ = -0x10;
  }
  return loop_local._4_4_;
}

Assistant:

static int uv__work_cancel(uv_loop_t* loop, uv_req_t* req, struct uv__work* w) {
  int cancelled;

  uv_once(&once, init_once);  /* Ensure |mutex| is initialized. */
  uv_mutex_lock(&mutex);
  uv_mutex_lock(&w->loop->wq_mutex);

  cancelled = !uv__queue_empty(&w->wq) && w->work != NULL;
  if (cancelled)
    uv__queue_remove(&w->wq);

  uv_mutex_unlock(&w->loop->wq_mutex);
  uv_mutex_unlock(&mutex);

  if (!cancelled)
    return UV_EBUSY;

  w->work = uv__cancelled;
  uv_mutex_lock(&loop->wq_mutex);
  uv__queue_insert_tail(&loop->wq, &w->wq);
  uv_async_send(&loop->wq_async);
  uv_mutex_unlock(&loop->wq_mutex);

  return 0;
}